

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O2

size_t __thiscall Lodtalk::MethodAssembler::Assembler::addLiteral(Assembler *this,Oop newLiteral)

{
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar1;
  size_t i;
  size_t sVar2;
  size_t sVar3;
  anon_union_8_4_0eb573b0_for_Oop_0 local_40;
  OopRef local_38;
  
  paVar1 = (anon_union_8_4_0eb573b0_for_Oop_0 *)
           (this->literals).super__Vector_base<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>.
           _M_impl.super__Vector_impl_data._M_start;
  sVar3 = (long)(this->literals).
                super__Vector_base<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)paVar1 >> 5;
  sVar2 = 0;
  while( true ) {
    if (sVar3 == sVar2) {
      local_40 = newLiteral.field_0;
      OopRef::OopRef(&local_38,(Oop *)&local_40);
      std::vector<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>::emplace_back<Lodtalk::OopRef>
                (&this->literals,&local_38);
      OopRef::~OopRef(&local_38);
      return sVar3;
    }
    if ((anon_union_8_4_0eb573b0_for_Oop_0)paVar1->pointer == newLiteral.field_0) break;
    sVar2 = sVar2 + 1;
    paVar1 = paVar1 + 4;
  }
  return sVar2;
}

Assistant:

size_t Assembler::addLiteral(Oop newLiteral)
{
	for (size_t i = 0; i < literals.size(); ++i)
	{
		if(literals[i] == newLiteral)
			return i;
	}

	auto ret = literals.size();
	literals.push_back(newLiteral);
	return ret;
}